

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetries.cc
# Opt level: O2

void gss::innards::find_symmetries
               (char *argv0,InputGraph *graph,
               list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *constraints,string *size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  __pid_t __pid;
  ostream *poVar6;
  istream *piVar7;
  ssize_t sVar8;
  undefined7 extraout_var;
  size_type __n;
  GapFailedUs *pGVar9;
  int n;
  int m;
  int stdout_pipefd [2];
  int stdin_pipefd [2];
  string local_14a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1488;
  ulong local_1468;
  string arg;
  string word;
  string line_to_write;
  int wstatus;
  string gap_helper_file_path_str;
  path gap_helper_file_path;
  char *argv0_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1388;
  string local_1368;
  stringstream output;
  char local_1338 [376];
  stringstream stdin_stream;
  ostream local_11b0 [376];
  char buf [4096];
  
  argv0_local = argv0;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&gap_helper_file_path,&argv0_local,auto_format);
  cVar1 = std::filesystem::__cxx11::path::has_filename();
  if (cVar1 != '\0') {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              ((path *)&gap_helper_file_path_str,(char (*) [4])"gap",auto_format);
    std::filesystem::__cxx11::operator/
              ((path *)&stdin_stream,(path *)&output,(path *)&gap_helper_file_path_str);
    std::filesystem::__cxx11::path::path<char[24],std::filesystem::__cxx11::path>
              ((path *)&line_to_write,(char (*) [24])"findDPfactorsOfGraphs.g",auto_format);
    std::filesystem::__cxx11::operator/((path *)buf,(path *)&stdin_stream,(path *)&line_to_write);
    std::filesystem::__cxx11::path::operator=(&gap_helper_file_path,(path *)buf);
    std::filesystem::__cxx11::path::~path((path *)buf);
    std::filesystem::__cxx11::path::~path((path *)&line_to_write);
    std::filesystem::__cxx11::path::~path((path *)&stdin_stream);
    std::filesystem::__cxx11::path::~path((path *)&gap_helper_file_path_str);
    std::filesystem::__cxx11::path::~path((path *)&output);
  }
  bVar2 = std::filesystem::exists(&gap_helper_file_path);
  if (!bVar2) {
    pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buf,
               "couldn\'t find gap/findDPfactorsOfGraphs.g, which we need for symmetry detection",
               (allocator<char> *)&stdin_stream);
    GapFailedUs::GapFailedUs(pGVar9,(string *)buf);
    __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  std::__cxx11::string::string
            ((string *)&gap_helper_file_path_str,&gap_helper_file_path._M_pathname);
  std::__cxx11::stringstream::stringstream((stringstream *)&stdin_stream);
  iVar3 = InputGraph::size(graph);
  poVar6 = (ostream *)std::ostream::operator<<(local_11b0,iVar3);
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar3 = 0;
  while( true ) {
    iVar4 = InputGraph::size(graph);
    if (iVar4 <= iVar3) break;
    iVar4 = InputGraph::degree(graph,iVar3);
    std::ostream::operator<<(local_11b0,iVar4);
    iVar4 = 0;
    while( true ) {
      iVar5 = InputGraph::size(graph);
      if (iVar5 <= iVar4) break;
      bVar2 = InputGraph::adjacent(graph,iVar3,iVar4);
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)local_11b0," ");
        std::ostream::operator<<((ostream *)poVar6,iVar4);
      }
      iVar4 = iVar4 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)local_11b0);
    iVar3 = iVar3 + 1;
  }
  iVar3 = pipe2(stdin_pipefd,0x80000);
  if (iVar3 == 0) {
    iVar3 = pipe2(stdout_pipefd,0x80000);
    if (iVar3 != 0) {
      pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)buf,"couldn\'t make stdout pipes",(allocator<char> *)&output);
      GapFailedUs::GapFailedUs(pGVar9,(string *)buf);
      __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    __pid = fork();
    if (__pid != -1) {
      if (__pid == 0) {
        dup2(stdin_pipefd[0],0);
        dup2(stdout_pipefd[1],1);
        execlp("gap","gap","-q","-A","-b",gap_helper_file_path_str._M_dataplus._M_p,0);
        pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)buf,"exec gap failed",(allocator<char> *)&output);
        GapFailedUs::GapFailedUs(pGVar9,(string *)buf);
        __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
      }
      close(stdin_pipefd[0]);
      close(stdout_pipefd[1]);
      line_to_write._M_dataplus._M_p = (pointer)&line_to_write.field_2;
      line_to_write._M_string_length = 0;
      line_to_write.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&stdin_stream,(string *)&line_to_write);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&line_to_write,"\n");
        while (line_to_write._M_string_length != 0) {
          sVar8 = write(stdin_pipefd[1],line_to_write._M_dataplus._M_p,
                        line_to_write._M_string_length);
          if ((int)sVar8 == -1) {
            pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)buf,"write failed",(allocator<char> *)&output);
            GapFailedUs::GapFailedUs(pGVar9,(string *)buf);
            __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (&line_to_write,0,(long)(int)sVar8);
        }
      }
      close(stdin_pipefd[1]);
      std::__cxx11::stringstream::stringstream((stringstream *)&output);
      while( true ) {
        sVar8 = read(stdout_pipefd[0],buf,0x1000);
        if (sVar8 == 0) break;
        if (sVar8 == -1) {
          pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&word,"read failed",(allocator<char> *)&arg);
          GapFailedUs::GapFailedUs(pGVar9,&word);
          __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
        }
        std::ostream::write(local_1338,(long)buf);
      }
      close(stdout_pipefd[0]);
      wstatus = 0;
      waitpid(__pid,&wstatus,0);
      word._M_dataplus._M_p = (pointer)&word.field_2;
      arg._M_dataplus._M_p = (pointer)&arg.field_2;
      local_1468 = 0;
      word._M_string_length = 0;
      arg._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      arg.field_2._M_local_buf[0] = '\0';
      while( true ) {
        while( true ) {
          piVar7 = std::operator>>((istream *)&output,(string *)&word);
          piVar7 = std::operator>>(piVar7,(string *)&arg);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
            if ((local_1468 & 1) != 0) {
              std::__cxx11::string::~string((string *)&arg);
              std::__cxx11::string::~string((string *)&word);
              std::__cxx11::stringstream::~stringstream((stringstream *)&output);
              std::__cxx11::string::~string((string *)&line_to_write);
              std::__cxx11::stringstream::~stringstream((stringstream *)&stdin_stream);
              std::__cxx11::string::~string((string *)&gap_helper_file_path_str);
              std::filesystem::__cxx11::path::~path(&gap_helper_file_path);
              return;
            }
            pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_14a8,"parsing output failed",(allocator<char> *)&local_1488)
            ;
            GapFailedUs::GapFailedUs(pGVar9,&local_14a8);
            __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
          }
          bVar2 = std::operator==(&word,"--pattern-automorphism-group-size");
          if (!bVar2) break;
          local_1468 = CONCAT71(extraout_var,1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (size,&arg);
        }
        bVar2 = std::operator==(&word,"--pattern-less-than");
        if (!bVar2) break;
        if (((arg._M_string_length < 3) || (*arg._M_dataplus._M_p != '\'')) ||
           (arg._M_dataplus._M_p[arg._M_string_length - 1] != '\'')) {
          pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
          std::operator+(&local_1488,"can\'t parse pattern-less-than \'",&arg);
          std::operator+(&local_14a8,&local_1488,"\': not quoted");
          GapFailedUs::GapFailedUs(pGVar9,&local_14a8);
          __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&arg,0,1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&arg,arg._M_string_length - 1,0xffffffffffffffff);
        __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&arg,'<',0);
        if (__n == 0xffffffffffffffff) {
          pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
          std::operator+(&local_1488,"can\'t parse pattern-less-than \'",&arg);
          std::operator+(&local_14a8,&local_1488,"\': no less than");
          GapFailedUs::GapFailedUs(pGVar9,&local_14a8);
          __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_1488,&arg,0,__n);
        iVar3 = std::__cxx11::stoi(&local_1488,(size_t *)0x0,10);
        InputGraph::vertex_name_abi_cxx11_(&local_14a8,graph,iVar3);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_1388,&arg,__n + 1,0xffffffffffffffff);
        iVar3 = std::__cxx11::stoi(&local_1388,(size_t *)0x0,10);
        InputGraph::vertex_name_abi_cxx11_(&local_1368,graph,iVar3);
        std::__cxx11::
        list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::__cxx11::string,std::__cxx11::string>
                  ((list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    *)constraints,&local_14a8,&local_1368);
        std::__cxx11::string::~string((string *)&local_1368);
        std::__cxx11::string::~string((string *)&local_1388);
        std::__cxx11::string::~string((string *)&local_14a8);
        std::__cxx11::string::~string((string *)&local_1488);
      }
      pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
      std::operator+(&local_1488,"unknown option \'",&word);
      std::operator+(&local_14a8,&local_1488,"\'");
      GapFailedUs::GapFailedUs(pGVar9,&local_14a8);
      __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
    }
    pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buf,"fork failed",(allocator<char> *)&output);
    GapFailedUs::GapFailedUs(pGVar9,(string *)buf);
    __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
  }
  pGVar9 = (GapFailedUs *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buf,"couldn\'t make stdin pipes",(allocator<char> *)&output);
  GapFailedUs::GapFailedUs(pGVar9,(string *)buf);
  __cxa_throw(pGVar9,&GapFailedUs::typeinfo,GapFailedUs::~GapFailedUs);
}

Assistant:

auto gss::innards::find_symmetries(
    const char * const argv0,
    const InputGraph & graph,
    std::list<std::pair<std::string, std::string>> & constraints,
    std::string & size) -> void
{
    path gap_helper_file_path = argv0;
    if (gap_helper_file_path.has_filename()) {
        gap_helper_file_path = gap_helper_file_path.parent_path() / "gap" / "findDPfactorsOfGraphs.g";
    }

    if (! exists(gap_helper_file_path))
        throw GapFailedUs{"couldn't find gap/findDPfactorsOfGraphs.g, which we need for symmetry detection"};

#if defined(STD_FS_IS_BOOST)
    string gap_helper_file_path_str = gap_helper_file_path.string();
#else
    string gap_helper_file_path_str = gap_helper_file_path;
#endif

    stringstream stdin_stream;
    stdin_stream << graph.size() << endl;
    for (int n = 0; n < graph.size(); ++n) {
        stdin_stream << graph.degree(n);
        for (int m = 0; m < graph.size(); ++m)
            if (graph.adjacent(n, m))
                stdin_stream << " " << m;
        stdin_stream << endl;
    }

    int stdin_pipefd[2], stdout_pipefd[2];

#ifdef __linux__
    if (0 != pipe2(stdin_pipefd, O_CLOEXEC))
        throw GapFailedUs{"couldn't make stdin pipes"};
    if (0 != pipe2(stdout_pipefd, O_CLOEXEC))
        throw GapFailedUs{"couldn't make stdout pipes"};
#else
    if (0 != pipe(stdin_pipefd))
        throw GapFailedUs{"couldn't make stdin pipes"};
    if (0 != pipe(stdout_pipefd))
        throw GapFailedUs{"couldn't make stdout pipes"};
    fcntl(stdin_pipefd[0], F_SETFD, FD_CLOEXEC);
    fcntl(stdin_pipefd[1], F_SETFD, FD_CLOEXEC);
    fcntl(stdout_pipefd[0], F_SETFD, FD_CLOEXEC);
    fcntl(stdout_pipefd[1], F_SETFD, FD_CLOEXEC);
#endif

    pid_t child_pid = fork();

    if (0 == child_pid) {
        dup2(stdin_pipefd[0], STDIN_FILENO);
        dup2(stdout_pipefd[1], STDOUT_FILENO);
        execlp("gap", "gap", "-q", "-A", "-b", gap_helper_file_path_str.c_str(), static_cast<char *>(nullptr));
        throw GapFailedUs{"exec gap failed"};
    }

    if (-1 == child_pid)
        throw GapFailedUs{"fork failed"};

    close(stdin_pipefd[0]);
    close(stdout_pipefd[1]);

    string line_to_write;
    while (getline(stdin_stream, line_to_write)) {
        line_to_write.append("\n");
        while (! line_to_write.empty()) {
            int written = write(stdin_pipefd[1], line_to_write.c_str(), line_to_write.length());
            if (-1 == written)
                throw GapFailedUs{"write failed"};
            line_to_write.erase(0, written);
        }
    }
    close(stdin_pipefd[1]);

    stringstream output;

    char buf[4096];
    ssize_t read_size;
    while (true) {
        read_size = read(stdout_pipefd[0], buf, 4096);
        if (-1 == read_size)
            throw GapFailedUs{"read failed"};
        else if (0 == read_size)
            break;
        output.write(buf, read_size);
    }

    close(stdout_pipefd[0]);

    int wstatus = 0;
    waitpid(child_pid, &wstatus, 0);
    bool found_size = 0;
    string word, arg;

    while (output >> word >> arg) {
        if (word == "--pattern-automorphism-group-size") {
            size = arg;
            found_size = true;
        }
        else if (word == "--pattern-less-than") {
            if (arg.length() < 3 || '\'' != arg[0] || '\'' != arg[arg.length() - 1])
                throw GapFailedUs{"can't parse pattern-less-than '" + arg + "': not quoted"};
            arg.erase(0, 1);
            arg.erase(arg.length() - 1);

            auto p = arg.find('<');
            if (p == string::npos)
                throw GapFailedUs{"can't parse pattern-less-than '" + arg + "': no less than"};
            constraints.emplace_back(graph.vertex_name(stoi(arg.substr(0, p))), graph.vertex_name(stoi(arg.substr(p + 1))));
        }
        else
            throw GapFailedUs{"unknown option '" + word + "'"};
    }

    if (! found_size)
        throw GapFailedUs{"parsing output failed"};
}